

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcMem.c
# Opt level: O3

Vec_Int_t * Wlc_NtkExtractCisForThisRead(Vec_Int_t *vReachReadCi,int iRead)

{
  uint uVar1;
  Vec_Int_t *p;
  int *piVar2;
  long lVar3;
  long lVar4;
  
  p = (Vec_Int_t *)malloc(0x10);
  p->nCap = 100;
  p->nSize = 0;
  piVar2 = (int *)malloc(400);
  p->pArray = piVar2;
  uVar1 = vReachReadCi->nSize;
  if (2 < (int)uVar1) {
    lVar3 = 0;
    lVar4 = 0;
    do {
      if ((int)uVar1 <= lVar3) goto LAB_0036227d;
      if (vReachReadCi->pArray[lVar3] == iRead) {
        if ((ulong)uVar1 <= lVar3 + 1U) {
LAB_0036227d:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        Vec_IntPush(p,vReachReadCi->pArray[lVar3 + 1]);
        if (vReachReadCi->nSize <= (int)lVar3 + 2) goto LAB_0036227d;
        Vec_IntPush(p,vReachReadCi->pArray[lVar3 + 2]);
        uVar1 = vReachReadCi->nSize;
      }
      lVar4 = lVar4 + 1;
      lVar3 = lVar3 + 3;
    } while (lVar4 < (int)uVar1 / 3);
  }
  return p;
}

Assistant:

Vec_Int_t * Wlc_NtkExtractCisForThisRead( Vec_Int_t * vReachReadCi, int iRead )
{
    int k;
    Vec_Int_t * vRes = Vec_IntAlloc( 100 );
    for ( k = 0; k < Vec_IntSize(vReachReadCi)/3; k++ )
    {
        if ( iRead != Vec_IntEntry( vReachReadCi, 3*k ) )
            continue;
        Vec_IntPush( vRes, Vec_IntEntry( vReachReadCi, 3*k+1 ) );
        Vec_IntPush( vRes, Vec_IntEntry( vReachReadCi, 3*k+2 ) );
    }
    return vRes;
}